

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

void __thiscall dg::llvmdg::CallGraph::CallGraph(CallGraph *this,Module *m)

{
  Module *m_00;
  LazyLLVMCallGraph *in_RSI;
  LLVMPointerAnalysis *in_RDI;
  pointer in_stack_ffffffffffffffd8;
  
  m_00 = (Module *)operator_new(0xe0);
  LazyLLVMCallGraph::LazyLLVMCallGraph(in_RSI,m_00,in_RDI);
  std::unique_ptr<dg::llvmdg::CallGraphImpl,std::default_delete<dg::llvmdg::CallGraphImpl>>::
  unique_ptr<std::default_delete<dg::llvmdg::CallGraphImpl>,void>
            ((unique_ptr<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
              *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

CallGraph(const llvm::Module *m) : _impl(new LazyLLVMCallGraph(m)) {}